

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool flatbuffers::StringToNumber<signed_char>(char *s,char *val)

{
  bool bVar1;
  bool bVar2;
  int64_t in_RAX;
  char cVar3;
  int64_t i64;
  
  if ((s != (char *)0x0) && (val != (char *)0x0)) {
    cVar3 = '\0';
    i64 = in_RAX;
    bVar1 = StringToIntegerImpl<long>(&i64,s,0,false);
    bVar2 = false;
    if (bVar1) {
      if (i64 < 0x80) {
        bVar2 = -0x81 < i64;
        cVar3 = -0x80;
        if (-0x80 < i64) {
          cVar3 = (char)i64;
        }
      }
      else {
        cVar3 = '\x7f';
        bVar2 = false;
      }
    }
    *val = cVar3;
    return bVar2;
  }
  __assert_fail("s && val",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = signed char]");
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}